

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

domain_type * __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::bottom
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  error *this_00;
  allocator local_31;
  string local_30;
  
  if (this->m_current != this->m_start) {
    return this->m_start;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000H",&local_31);
  cov::error::error(this_00,&local_30);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline bool empty() const
		{
			return m_current == m_start;
		}